

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_dev_t ggml_backend_dev_get(size_t index)

{
  size_t sVar1;
  ggml_backend_registry *pgVar2;
  reference ppgVar3;
  ulong in_RDI;
  
  sVar1 = ggml_backend_dev_count();
  if (sVar1 <= in_RDI) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend-reg.cpp"
               ,0x15c,"GGML_ASSERT(%s) failed","index < ggml_backend_dev_count()");
  }
  pgVar2 = get_reg();
  ppgVar3 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::operator[]
                      (&pgVar2->devices,in_RDI);
  return *ppgVar3;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_get(size_t index) {
    GGML_ASSERT(index < ggml_backend_dev_count());
    return get_reg().devices[index];
}